

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O0

int __thiscall NetOptimize::fuse_deconvolutiondepthwise_activation(NetOptimize *this)

{
  float fVar1;
  int iVar2;
  FILE *__stream;
  bool bVar3;
  reference ppLVar4;
  reference pvVar5;
  size_type sVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  float *pfVar9;
  reference pvVar10;
  long in_RDI;
  int top_blob_index_final;
  Clip *clip;
  ReLU *relu;
  Layer *activation;
  DeconvolutionDepthWise *deconvolutiondepthwise;
  size_t j;
  int top_blob_index;
  size_t i;
  size_t layer_count;
  Allocator *in_stack_fffffffffffffec8;
  int in_stack_fffffffffffffed0;
  int in_stack_fffffffffffffed4;
  float in_stack_fffffffffffffed8;
  float in_stack_fffffffffffffedc;
  Mat *in_stack_fffffffffffffee0;
  Mat local_e8;
  value_type local_a0;
  value_type local_40;
  value_type local_38;
  value_type local_30;
  size_type local_28;
  value_type local_1c;
  size_type local_18;
  ulong local_10;
  
  local_10 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::size
                       (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58));
  local_18 = 0;
  do {
    if (local_10 <= local_18) {
      return 0;
    }
    std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
              (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),local_18);
    bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                            (char *)in_stack_fffffffffffffec8);
    if (!bVar3) {
      ppLVar4 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                          (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                            (in_RDI + 0x58),local_18);
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&(*ppLVar4)->tops,0);
      local_1c = *pvVar5;
      local_28 = local_18;
LAB_00159229:
      do {
        do {
          local_28 = local_28 + 1;
          if (local_10 <= local_28) goto LAB_00159346;
          std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                    (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),
                     local_28);
          bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                                  (char *)in_stack_fffffffffffffec8);
          if (bVar3) {
            std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                      (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),
                       local_28);
            bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0)
                                    ,(char *)in_stack_fffffffffffffec8);
            if (bVar3) {
              std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                        (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),
                         local_28);
              bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)CONCAT44(in_stack_fffffffffffffed4,
                                                  in_stack_fffffffffffffed0),
                                      (char *)in_stack_fffffffffffffec8);
              if (bVar3) goto LAB_00159229;
            }
          }
          ppLVar4 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                              (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                                (in_RDI + 0x58),local_28);
          sVar6 = std::vector<int,_std::allocator<int>_>::size(&(*ppLVar4)->bottoms);
        } while (sVar6 != 1);
        ppLVar4 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                            (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                              (in_RDI + 0x58),local_28);
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&(*ppLVar4)->bottoms,0);
      } while (*pvVar5 != local_1c);
LAB_00159346:
      if (local_28 != local_10) {
        ppLVar4 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                            (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                              (in_RDI + 0x58),local_18);
        local_30 = *ppLVar4;
        ppLVar4 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                            (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                              (in_RDI + 0x58),local_28);
        __stream = _stderr;
        local_38 = *ppLVar4;
        uVar7 = std::__cxx11::string::c_str();
        uVar8 = std::__cxx11::string::c_str();
        fprintf(__stream,"fuse_deconvolutiondepthwise_activation %s %s\n",uVar7,uVar8);
        bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                                (char *)in_stack_fffffffffffffec8);
        if (bVar3) {
          local_40 = local_38;
          if ((*(float *)&local_38[1]._vptr_Layer != 0.0) ||
             (NAN(*(float *)&local_38[1]._vptr_Layer))) {
            *(undefined4 *)((long)&local_30[1].type.field_2 + 8) = 2;
            ncnn::Mat::Mat(in_stack_fffffffffffffee0,(int)in_stack_fffffffffffffedc,
                           CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                           in_stack_fffffffffffffec8);
            ncnn::Mat::operator=
                      ((Mat *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                       (Mat *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
            ncnn::Mat::~Mat((Mat *)0x1594af);
            fVar1 = *(float *)&local_40[1]._vptr_Layer;
            pfVar9 = ncnn::Mat::operator[]((Mat *)&local_30[1].name,0);
            *pfVar9 = fVar1;
          }
          else {
            *(undefined4 *)((long)&local_30[1].type.field_2 + 8) = 1;
          }
        }
        else {
          bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                                  (char *)in_stack_fffffffffffffec8);
          if (bVar3) {
            local_a0 = local_38;
            *(undefined4 *)((long)&local_30[1].type.field_2 + 8) = 3;
            in_stack_fffffffffffffee0 = &local_e8;
            ncnn::Mat::Mat(in_stack_fffffffffffffee0,(int)in_stack_fffffffffffffedc,
                           CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                           in_stack_fffffffffffffec8);
            ncnn::Mat::operator=
                      ((Mat *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                       (Mat *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
            ncnn::Mat::~Mat((Mat *)0x159599);
            in_stack_fffffffffffffed8 = *(float *)&local_a0[1]._vptr_Layer;
            pfVar9 = ncnn::Mat::operator[]((Mat *)&local_30[1].name,0);
            *pfVar9 = in_stack_fffffffffffffed8;
            in_stack_fffffffffffffedc = *(float *)((long)&local_a0[1]._vptr_Layer + 4);
            pfVar9 = ncnn::Mat::operator[]((Mat *)&local_30[1].name,1);
            *pfVar9 = in_stack_fffffffffffffedc;
          }
          else {
            bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0)
                                    ,(char *)in_stack_fffffffffffffec8);
            if (bVar3) {
              *(undefined4 *)((long)&local_30[1].type.field_2 + 8) = 4;
            }
          }
        }
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_38->tops,0);
        iVar2 = *pvVar5;
        in_stack_fffffffffffffed0 = iVar2;
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_30->tops,0);
        *pvVar5 = in_stack_fffffffffffffed0;
        in_stack_fffffffffffffed4 = (int)local_18;
        pvVar10 = std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
                            (*(vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> **)(in_RDI + 0x50),
                             (long)iVar2);
        pvVar10->producer = in_stack_fffffffffffffed4;
        std::__cxx11::string::operator=((string *)&local_38->type,"ncnnfused");
      }
    }
    local_18 = local_18 + 1;
  } while( true );
}

Assistant:

int NetOptimize::fuse_deconvolutiondepthwise_activation()
{
    const size_t layer_count = layers.size();
    for (size_t i = 0; i < layer_count; i++)
    {
        if (layers[i]->type != "DeconvolutionDepthWise")
            continue;

        // DeconvolutionDepthWise - Activation
        int top_blob_index = layers[i]->tops[0];

        size_t j = i + 1;
        for (; j < layer_count; j++)
        {
            if (layers[j]->type != "ReLU" && layers[j]->type != "Clip" && layers[j]->type != "Sigmoid")
                continue;

            if (layers[j]->bottoms.size() != 1)
                continue;

            if (layers[j]->bottoms[0] == top_blob_index)
                break;
        }

        if (j == layer_count)
            continue;

        // fuse DeconvolutionDepthWise - Activation to DeconvolutionDepthWise
        ncnn::DeconvolutionDepthWise* deconvolutiondepthwise = (ncnn::DeconvolutionDepthWise*)layers[i];
        ncnn::Layer* activation = layers[j];

        fprintf(stderr, "fuse_deconvolutiondepthwise_activation %s %s\n", deconvolutiondepthwise->name.c_str(), activation->name.c_str());

        if (activation->type == "ReLU")
        {
            ncnn::ReLU* relu = (ncnn::ReLU*)activation;

            if (relu->slope == 0.f)
            {
                deconvolutiondepthwise->activation_type = 1;
            }
            else
            {
                deconvolutiondepthwise->activation_type = 2;
                deconvolutiondepthwise->activation_params = ncnn::Mat(1);
                deconvolutiondepthwise->activation_params[0] = relu->slope;
            }
        }
        else if (activation->type == "Clip")
        {
            ncnn::Clip* clip = (ncnn::Clip*)activation;

            deconvolutiondepthwise->activation_type = 3;
            deconvolutiondepthwise->activation_params = ncnn::Mat(2);
            deconvolutiondepthwise->activation_params[0] = clip->min;
            deconvolutiondepthwise->activation_params[1] = clip->max;
        }
        else if (activation->type == "Sigmoid")
        {
            deconvolutiondepthwise->activation_type = 4;
        }

        int top_blob_index_final = activation->tops[0];
        deconvolutiondepthwise->tops[0] = top_blob_index_final;
        blobs[top_blob_index_final].producer = i;
        activation->type = "ncnnfused";
    }

    return 0;
}